

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_temporal_filter_avx2.c
# Opt level: O1

void av1_highbd_apply_temporal_filter_avx2
               (YV12_BUFFER_CONFIG *frame_to_filter,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
               int mb_row,int mb_col,int num_planes,double *noise_levels,MV *subblock_mvs,
               int *subblock_mses,int q_factor,int filter_strength,int tf_wgt_calc_lvl,uint8_t *pred
               ,uint32_t *accum,uint16_t *count)

{
  uint16_t *puVar1;
  int *piVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  uint8_t *puVar7;
  undefined1 auVar8 [32];
  byte bVar9;
  byte bVar10;
  char cVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  byte bVar38;
  byte bVar39;
  uint uVar40;
  uint uVar41;
  ulong uVar43;
  undefined7 in_register_00000011;
  ulong uVar44;
  long lVar45;
  undefined1 (*pauVar46) [32];
  undefined1 (*pauVar47) [32];
  int iVar48;
  undefined1 (*pauVar49) [16];
  int *piVar50;
  int iVar51;
  undefined1 (*pauVar52) [16];
  undefined1 *puVar53;
  undefined1 (*pauVar54) [32];
  ulong uVar55;
  ulong uVar56;
  int iVar57;
  int subblock_idx;
  int iVar58;
  long lVar59;
  int iVar60;
  uint uVar61;
  uint uVar62;
  double dVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  double dVar70;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 extraout_var [56];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  double dVar71;
  undefined1 auVar72 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [12];
  undefined1 auVar95 [32];
  __m256i vsrc [5];
  double d_factor [4];
  double subblock_mses_scaled [4];
  uint32_t frame_sse [1152];
  uint32_t acc_5x5_sse [32] [32];
  uint32_t luma_sse_sum [1024];
  ulong local_3488;
  int local_3464;
  undefined8 local_3420 [7];
  undefined8 uStack_33e8;
  undefined8 local_33e0 [8];
  undefined1 local_33a0 [32];
  undefined1 local_3380 [16];
  double local_3370;
  long local_3368;
  undefined1 local_3360 [16];
  long local_3348;
  ulong local_3340;
  macroblockd_plane *local_3338;
  YV12_BUFFER_CONFIG *local_3330;
  ulong local_3328;
  uint16_t *local_3320;
  uint32_t *local_3318;
  ulong local_3310;
  ulong local_3308;
  ulong local_3300;
  uint16_t *local_32f8;
  undefined1 local_32f0 [16];
  double local_32e0 [4];
  undefined1 local_32c0 [32];
  double local_32a0 [4];
  double local_3280;
  double dStack_3278;
  double dStack_3270;
  double dStack_3268;
  int local_3260 [2];
  undefined1 auStack_3258 [32];
  undefined1 auStack_3238 [32];
  undefined1 auStack_3218 [32];
  undefined1 auStack_31f8 [4504];
  undefined1 local_2060 [16];
  undefined1 local_2050 [4080];
  int local_1060 [1036];
  ulong uVar42;
  
  uVar56 = CONCAT71(in_register_00000011,block_size) & 0xffffffff;
  iVar48 = (frame_to_filter->field_2).field_0.y_crop_width;
  iVar60 = (frame_to_filter->field_3).field_0.y_crop_height;
  if (iVar60 < iVar48) {
    iVar48 = iVar60;
  }
  bVar3 = block_size_high[uVar56];
  dVar71 = (double)q_factor / 20.0;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar71 * dVar71;
  auVar65 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar72);
  auVar64 = vcmpsd_avx(auVar72,ZEXT816(0x3ee4f8b588e368f1),1);
  auVar93._8_8_ = 0x3ee4f8b588e368f1;
  auVar93._0_8_ = 0x3ee4f8b588e368f1;
  local_3360 = vblendvpd_avx(auVar65,auVar93,auVar64);
  dVar71 = (double)q_factor * 0.015625;
  bVar4 = block_size_wide[uVar56];
  local_3370 = dVar71 * dVar71 * 0.5;
  dVar71 = (double)filter_strength * 0.25 * (double)filter_strength * 0.25;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar71;
  local_3380 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar64);
  local_32e0[0] = 0.0;
  local_32e0[1] = 0.0;
  local_32e0[2] = 0.0;
  local_32e0[3] = 0.0;
  lVar59 = 0;
  local_3330 = frame_to_filter;
  memset(local_3260,0,0x1200);
  memset(local_1060,0,0x1000);
  local_3368 = (long)pred * 2;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = (double)iVar48 * 0.1;
  auVar64 = vmaxsd_avx(auVar65,ZEXT816(0x3ff0000000000000));
  auVar78 = ZEXT1664(auVar64);
  do {
    auVar65 = vpmovsxwd_avx(ZEXT416((uint)subblock_mvs[lVar59]));
    auVar65 = vcvtdq2pd_avx(auVar65);
    dVar63 = auVar65._0_8_ * auVar65._0_8_;
    dVar70 = auVar65._8_8_ * auVar65._8_8_;
    auVar79._0_8_ = dVar63 + dVar70;
    auVar79._8_8_ = dVar63 + dVar70;
    if (auVar79._0_8_ < 0.0) {
      auVar78._0_8_ = sqrt(auVar79._0_8_);
      auVar78._8_56_ = extraout_var;
      auVar65 = auVar78._0_16_;
      auVar78 = ZEXT864(auVar64._0_8_);
    }
    else {
      auVar65 = vsqrtsd_avx(auVar79,auVar79);
    }
    auVar66._0_8_ = auVar65._0_8_ / auVar78._0_8_;
    auVar66._8_8_ = auVar65._8_8_;
    auVar65 = vmaxsd_avx(auVar66,ZEXT816(0x3ff0000000000000));
    local_32e0[lVar59] = auVar65._0_8_;
    lVar59 = lVar59 + 1;
  } while (lVar59 != 4);
  if (q_factor < 0x80) {
    local_3370 = (double)local_3360._0_8_;
  }
  if (0 < num_planes) {
    auVar67._8_8_ = 0;
    auVar67._0_8_ = dVar71;
    auVar64 = vcmpsd_avx(auVar67,ZEXT816(0x3ee4f8b588e368f1),1);
    local_32f0 = vblendvpd_avx(local_3380,auVar93,auVar64);
    local_3338 = mbd->plane;
    local_3280 = local_32e0[0];
    dStack_3278 = local_32e0[1];
    dStack_3270 = local_32e0[2];
    dStack_3268 = local_32e0[3];
    local_3348 = local_3368 + 0x20;
    uVar56 = 0;
    local_3464 = 0;
    local_3340 = (ulong)(uint)num_planes;
    do {
      bVar38 = bVar3 >> ((byte)local_3338[uVar56].subsampling_y & 0x1f);
      uVar40 = (uint)bVar38;
      uVar42 = (ulong)uVar40;
      bVar39 = bVar4 >> ((byte)local_3338[uVar56].subsampling_x & 0x1f);
      uVar43 = (ulong)bVar39;
      iVar60 = local_3338[uVar56].subsampling_x - mbd->plane[0].subsampling_x;
      iVar48 = local_3338[uVar56].subsampling_y - mbd->plane[0].subsampling_y;
      bVar9 = (byte)iVar48;
      bVar10 = (byte)iVar60;
      dVar71 = 0.04;
      if (uVar56 != 0) {
        dVar71 = 1.0 / (double)((1 << (bVar9 + bVar10 & 0x1f)) + 0x19);
      }
      uVar6 = *(uint *)((long)local_3330->store_buf_adr + (ulong)(uVar56 != 0) * 4 + -0x28);
      puVar7 = local_3330->store_buf_adr[uVar56 - 4];
      dVar63 = log(noise_levels[uVar56] + noise_levels[uVar56] + 5.0);
      if ((uVar56 == 1) && (uVar40 != 0)) {
        uVar41 = 1 << (bVar9 & 0x1f);
        uVar61 = 1 << (bVar10 & 0x1f);
        if ((int)uVar61 < 2) {
          uVar61 = 1;
        }
        if ((int)uVar41 < 2) {
          uVar41 = 1;
        }
        local_3488 = 0;
        do {
          if (bVar39 != 0) {
            uVar55 = 0;
            do {
              if (iVar48 != 0x1f) {
                iVar57 = ((int)uVar55 << (bVar10 & 0x1f)) +
                         ((int)local_3488 << (bVar9 & 0x1f)) * 0x24 + 2;
                lVar59 = uVar55 + local_3488 * 0x20;
                uVar62 = 0;
                do {
                  if (iVar60 != 0x1f) {
                    iVar58 = local_1060[lVar59];
                    uVar44 = (ulong)uVar61;
                    iVar51 = iVar57;
                    do {
                      iVar58 = iVar58 + local_3260[iVar51];
                      iVar51 = iVar51 + 1;
                      uVar44 = uVar44 - 1;
                    } while (uVar44 != 0);
                    local_1060[lVar59] = iVar58;
                  }
                  uVar62 = uVar62 + 1;
                  iVar57 = iVar57 + 0x24;
                } while (uVar62 != uVar41);
              }
              uVar55 = uVar55 + 1;
            } while (uVar55 != uVar43);
          }
          local_3488 = local_3488 + 1;
        } while (local_3488 != uVar42);
      }
      uVar61 = (uint)bVar39;
      lVar45 = (long)(int)(uVar61 * mb_col + uVar6 * uVar40 * mb_row);
      lVar59 = (long)local_3464;
      pauVar54 = (undefined1 (*) [32])(local_3368 + lVar59 * 2);
      iVar48 = mbd->bd;
      if (uVar61 == 0x20) {
        if (uVar40 != 0) {
          pauVar46 = (undefined1 (*) [32])((long)puVar7 * 2 + lVar45 * 2 + 0x20);
          pauVar47 = (undefined1 (*) [32])(local_3348 + lVar59 * 2);
          lVar45 = 0;
          do {
            auVar95 = vpsubw_avx2(pauVar46[-1],pauVar47[-1]);
            auVar83 = vpmullw_avx2(auVar95,auVar95);
            auVar95 = vpmulhw_avx2(auVar95,auVar95);
            auVar8 = vpunpcklwd_avx2(auVar83,auVar95);
            auVar95 = vpunpckhwd_avx2(auVar83,auVar95);
            auVar81._0_16_ = ZEXT116(0) * auVar95._0_16_ + ZEXT116(1) * auVar8._0_16_;
            auVar81._16_16_ = ZEXT116(0) * auVar8._16_16_ + ZEXT116(1) * auVar95._0_16_;
            auVar95 = vperm2i128_avx2(auVar8,auVar95,0x31);
            *(undefined1 (*) [32])(auStack_3258 + lVar45) = auVar81;
            *(undefined1 (*) [32])(auStack_3238 + lVar45) = auVar95;
            auVar95 = vpsubw_avx2(*pauVar46,*pauVar47);
            auVar83 = vpmullw_avx2(auVar95,auVar95);
            auVar95 = vpmulhw_avx2(auVar95,auVar95);
            auVar8 = vpunpcklwd_avx2(auVar83,auVar95);
            auVar95 = vpunpckhwd_avx2(auVar83,auVar95);
            auVar82._0_16_ = ZEXT116(0) * auVar95._0_16_ + ZEXT116(1) * auVar8._0_16_;
            auVar82._16_16_ = ZEXT116(0) * auVar8._16_16_ + ZEXT116(1) * auVar95._0_16_;
            auVar95 = vperm2i128_avx2(auVar8,auVar95,0x31);
            *(undefined1 (*) [32])(auStack_3218 + lVar45) = auVar82;
            *(undefined1 (*) [32])(auStack_31f8 + lVar45) = auVar95;
            pauVar46 = (undefined1 (*) [32])(*pauVar46 + (ulong)uVar6 * 2);
            pauVar47 = pauVar47 + 2;
            lVar45 = lVar45 + 0x90;
          } while (uVar40 * 0x90 != (int)lVar45);
        }
      }
      else if (uVar40 != 0) {
        pauVar47 = (undefined1 (*) [32])(lVar45 * 2 + (long)puVar7 * 2);
        lVar45 = 0;
        pauVar46 = pauVar54;
        do {
          auVar95 = vpsubw_avx2(*pauVar47,*pauVar46);
          auVar83 = vpmullw_avx2(auVar95,auVar95);
          auVar95 = vpmulhw_avx2(auVar95,auVar95);
          auVar8 = vpunpcklwd_avx2(auVar83,auVar95);
          auVar95 = vpunpckhwd_avx2(auVar83,auVar95);
          auVar83._0_16_ = ZEXT116(0) * auVar95._0_16_ + ZEXT116(1) * auVar8._0_16_;
          auVar83._16_16_ = ZEXT116(0) * auVar8._16_16_ + ZEXT116(1) * auVar95._0_16_;
          auVar95 = vperm2i128_avx2(auVar8,auVar95,0x31);
          *(undefined1 (*) [32])(auStack_3258 + lVar45) = auVar83;
          *(undefined1 (*) [32])(auStack_3238 + lVar45) = auVar95;
          pauVar47 = (undefined1 (*) [32])(*pauVar47 + (ulong)uVar6 * 2);
          pauVar46 = (undefined1 (*) [32])(*pauVar46 + uVar61 * 2);
          lVar45 = lVar45 + 0x90;
        } while (uVar40 * 0x90 != (int)lVar45);
      }
      dVar63 = 1.0 / ((dVar63 + 0.5) * local_3370 * (double)local_32f0._0_8_);
      lVar45 = 0x40;
      pauVar47 = (undefined1 (*) [32])local_3260;
      do {
        auVar64 = vpermilps_avx(*(undefined1 (*) [16])*pauVar47,0xea);
        auVar95 = vblendpd_avx(ZEXT1632(auVar64),*pauVar47,0xc);
        *(undefined1 (*) [32])((long)local_3420 + lVar45) = auVar95;
        pauVar47 = (undefined1 (*) [32])(pauVar47[4] + 0x10);
        lVar45 = lVar45 + 0x20;
      } while (lVar45 != 0xa0);
      local_3420[0] = local_33e0[0];
      local_3420[1] = local_33e0[1];
      local_3420[2] = local_33e0[2];
      local_3420[3] = local_33e0[3];
      local_3420[4] = local_33e0[0];
      local_3420[5] = local_33e0[1];
      local_3420[6] = local_33e0[2];
      uStack_33e8 = local_33e0[3];
      uVar55 = (ulong)(uVar40 - 3);
      auVar94 = SUB6412(ZEXT864(0),4);
      auVar64 = SUB6416(ZEXT864(0),0);
      auVar95 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if (3 < uVar40) {
        pauVar52 = &local_2060;
        lVar45 = 0;
        do {
          auVar20._8_8_ = local_3420[5];
          auVar20._0_8_ = local_3420[4];
          auVar20._16_8_ = local_3420[6];
          auVar20._24_8_ = uStack_33e8;
          auVar8._8_8_ = local_3420[1];
          auVar8._0_8_ = local_3420[0];
          auVar8._16_8_ = local_3420[2];
          auVar8._24_8_ = local_3420[3];
          auVar83 = vpaddd_avx2(auVar20,auVar8);
          local_3420[0] = local_3420[4];
          local_3420[1] = local_3420[5];
          local_3420[2] = local_3420[6];
          local_3420[3] = uStack_33e8;
          local_3420[4] = local_33e0[0];
          local_3420[5] = local_33e0[1];
          local_3420[6] = local_33e0[2];
          uStack_33e8 = local_33e0[3];
          auVar26._8_8_ = local_33e0[1];
          auVar26._0_8_ = local_33e0[0];
          auVar26._16_8_ = local_33e0[2];
          auVar26._24_8_ = local_33e0[3];
          auVar83 = vpaddd_avx2(auVar83,auVar26);
          local_33e0[0] = local_33e0[4];
          local_33e0[1] = local_33e0[5];
          local_33e0[2] = local_33e0[6];
          local_33e0[3] = local_33e0[7];
          auVar32._8_8_ = local_33e0[5];
          auVar32._0_8_ = local_33e0[4];
          auVar32._16_8_ = local_33e0[6];
          auVar32._24_8_ = local_33e0[7];
          auVar83 = vpaddd_avx2(auVar83,auVar32);
          local_33e0[4] = local_33a0._0_8_;
          local_33e0[5] = local_33a0._8_8_;
          local_33e0[6] = local_33a0._16_8_;
          local_33e0[7] = local_33a0._24_8_;
          auVar83 = vpaddd_avx2(auVar83,local_33a0);
          auVar65 = vpermilps_avx(*(undefined1 (*) [16])(*pauVar47 + lVar45),0xea);
          local_33a0 = vblendps_avx(ZEXT1632(auVar65),*(undefined1 (*) [32])(*pauVar47 + lVar45),
                                    0xf0);
          auVar88._4_12_ = auVar94;
          auVar88._0_4_ = auVar83._16_4_;
          auVar65 = vpaddd_avx(auVar83._0_16_,auVar88);
          auVar72 = vpshufd_avx(auVar65,0xee);
          auVar65 = vpaddd_avx(auVar65,auVar72);
          auVar8 = vpblendd_avx2(auVar83,auVar95,0xc1);
          auVar72 = vpaddd_avx(auVar8._0_16_,auVar8._16_16_);
          auVar93 = vpsrldq_avx(auVar72,8);
          auVar72 = vpaddd_avx(auVar72,auVar93);
          auVar72 = vphaddd_avx(auVar65,auVar72);
          auVar8 = vpblendd_avx2(auVar83,auVar95,0x83);
          auVar65 = vpaddd_avx(auVar8._0_16_,auVar8._16_16_);
          auVar93 = vpsrldq_avx(auVar65,8);
          auVar65 = vpaddd_avx(auVar65,auVar93);
          auVar93 = vphaddd_avx(auVar65,auVar65);
          auVar65 = vblendps_avx(auVar64,auVar83._0_16_,8);
          auVar65 = vpaddd_avx(auVar65,auVar83._16_16_);
          auVar79 = vpsrldq_avx(auVar65,8);
          auVar65 = vpaddd_avx(auVar65,auVar79);
          auVar65 = vphaddd_avx(auVar65,auVar65);
          auVar72 = vpshufd_avx(auVar72,0xe8);
          auVar72 = vpunpcklqdq_avx(auVar72,auVar93);
          auVar73._0_4_ = auVar65._0_4_;
          auVar73._4_4_ = auVar73._0_4_;
          auVar73._8_4_ = auVar73._0_4_;
          auVar73._12_4_ = auVar73._0_4_;
          auVar65 = vpblendd_avx2(auVar72,auVar73,8);
          *pauVar52 = auVar65;
          lVar45 = lVar45 + 0x90;
          pauVar52 = pauVar52 + 8;
        } while (uVar55 * 0x90 != lVar45);
      }
      lVar45 = -0x180;
      do {
        auVar21._8_8_ = local_3420[5];
        auVar21._0_8_ = local_3420[4];
        auVar21._16_8_ = local_3420[6];
        auVar21._24_8_ = uStack_33e8;
        auVar15._8_8_ = local_3420[1];
        auVar15._0_8_ = local_3420[0];
        auVar15._16_8_ = local_3420[2];
        auVar15._24_8_ = local_3420[3];
        auVar83 = vpaddd_avx2(auVar21,auVar15);
        local_3420[0] = local_3420[4];
        local_3420[1] = local_3420[5];
        local_3420[2] = local_3420[6];
        local_3420[3] = uStack_33e8;
        local_3420[4] = local_33e0[0];
        local_3420[5] = local_33e0[1];
        local_3420[6] = local_33e0[2];
        uStack_33e8 = local_33e0[3];
        auVar27._8_8_ = local_33e0[1];
        auVar27._0_8_ = local_33e0[0];
        auVar27._16_8_ = local_33e0[2];
        auVar27._24_8_ = local_33e0[3];
        auVar83 = vpaddd_avx2(auVar83,auVar27);
        local_33e0[0] = local_33e0[4];
        local_33e0[1] = local_33e0[5];
        local_33e0[2] = local_33e0[6];
        local_33e0[3] = local_33e0[7];
        auVar33._8_8_ = local_33e0[5];
        auVar33._0_8_ = local_33e0[4];
        auVar33._16_8_ = local_33e0[6];
        auVar33._24_8_ = local_33e0[7];
        auVar83 = vpaddd_avx2(auVar83,auVar33);
        auVar83 = vpaddd_avx2(auVar83,local_33a0);
        auVar90._4_12_ = auVar94;
        auVar90._0_4_ = auVar83._16_4_;
        auVar65 = vpaddd_avx(auVar83._0_16_,auVar90);
        auVar72 = vpshufd_avx(auVar65,0xee);
        auVar65 = vpaddd_avx(auVar65,auVar72);
        auVar8 = vpblendd_avx2(auVar83,auVar95,0xc1);
        auVar72 = vpaddd_avx(auVar8._0_16_,auVar8._16_16_);
        auVar93 = vpsrldq_avx(auVar72,8);
        auVar72 = vpaddd_avx(auVar72,auVar93);
        auVar72 = vphaddd_avx(auVar65,auVar72);
        auVar8 = vpblendd_avx2(auVar83,auVar95,0x83);
        auVar65 = vpaddd_avx(auVar8._0_16_,auVar8._16_16_);
        auVar93 = vpsrldq_avx(auVar65,8);
        auVar65 = vpaddd_avx(auVar65,auVar93);
        auVar93 = vphaddd_avx(auVar65,auVar65);
        auVar65 = vblendps_avx(auVar64,auVar83._0_16_,8);
        auVar65 = vpaddd_avx(auVar65,auVar83._16_16_);
        auVar79 = vpsrldq_avx(auVar65,8);
        auVar65 = vpaddd_avx(auVar65,auVar79);
        auVar65 = vphaddd_avx(auVar65,auVar65);
        local_33e0[4] = local_33a0._0_8_;
        local_33e0[5] = local_33a0._8_8_;
        local_33e0[6] = local_33a0._16_8_;
        local_33e0[7] = local_33a0._24_8_;
        auVar72 = vpshufd_avx(auVar72,0xe8);
        auVar72 = vpunpcklqdq_avx(auVar72,auVar93);
        auVar84._0_4_ = auVar65._0_4_;
        auVar84._4_4_ = auVar84._0_4_;
        auVar84._8_4_ = auVar84._0_4_;
        auVar84._12_4_ = auVar84._0_4_;
        auVar65 = vpblendd_avx2(auVar72,auVar84,8);
        *(undefined1 (*) [16])(local_2060 + lVar45 + (ulong)bVar38 * 0x80) = auVar65;
        lVar45 = lVar45 + 0x80;
      } while (lVar45 != 0);
      uVar44 = 4;
      if (8 < uVar61) {
        puVar53 = local_2060 + (ulong)bVar38 * 0x80;
        uVar44 = 4;
        pauVar52 = (undefined1 (*) [16])local_2050;
        do {
          piVar50 = local_3260 + uVar44;
          lVar45 = 0x40;
          do {
            uVar12 = *(undefined8 *)(piVar50 + 2);
            uVar13 = *(undefined8 *)(piVar50 + 4);
            uVar14 = *(undefined8 *)(piVar50 + 6);
            *(undefined8 *)((long)local_3420 + lVar45) = *(undefined8 *)piVar50;
            *(undefined8 *)((long)local_3420 + lVar45 + 8) = uVar12;
            *(undefined8 *)((long)local_3420 + lVar45 + 0x10) = uVar13;
            *(undefined8 *)((long)local_3420 + lVar45 + 0x18) = uVar14;
            piVar50 = piVar50 + 0x24;
            lVar45 = lVar45 + 0x20;
          } while (lVar45 != 0xa0);
          local_3420[0] = local_33e0[0];
          local_3420[1] = local_33e0[1];
          local_3420[2] = local_33e0[2];
          local_3420[3] = local_33e0[3];
          local_3420[4] = local_33e0[0];
          local_3420[5] = local_33e0[1];
          local_3420[6] = local_33e0[2];
          uStack_33e8 = local_33e0[3];
          if (3 < uVar40) {
            lVar45 = 0;
            pauVar49 = pauVar52;
            do {
              auVar22._8_8_ = local_3420[5];
              auVar22._0_8_ = local_3420[4];
              auVar22._16_8_ = local_3420[6];
              auVar22._24_8_ = uStack_33e8;
              auVar16._8_8_ = local_3420[1];
              auVar16._0_8_ = local_3420[0];
              auVar16._16_8_ = local_3420[2];
              auVar16._24_8_ = local_3420[3];
              auVar83 = vpaddd_avx2(auVar22,auVar16);
              local_3420[0] = local_3420[4];
              local_3420[1] = local_3420[5];
              local_3420[2] = local_3420[6];
              local_3420[3] = uStack_33e8;
              local_3420[4] = local_33e0[0];
              local_3420[5] = local_33e0[1];
              local_3420[6] = local_33e0[2];
              uStack_33e8 = local_33e0[3];
              auVar28._8_8_ = local_33e0[1];
              auVar28._0_8_ = local_33e0[0];
              auVar28._16_8_ = local_33e0[2];
              auVar28._24_8_ = local_33e0[3];
              auVar83 = vpaddd_avx2(auVar83,auVar28);
              local_33e0[0] = local_33e0[4];
              local_33e0[1] = local_33e0[5];
              local_33e0[2] = local_33e0[6];
              local_33e0[3] = local_33e0[7];
              auVar34._8_8_ = local_33e0[5];
              auVar34._0_8_ = local_33e0[4];
              auVar34._16_8_ = local_33e0[6];
              auVar34._24_8_ = local_33e0[7];
              auVar83 = vpaddd_avx2(auVar83,auVar34);
              local_33e0[4] = local_33a0._0_8_;
              local_33e0[5] = local_33a0._8_8_;
              local_33e0[6] = local_33a0._16_8_;
              local_33e0[7] = local_33a0._24_8_;
              auVar83 = vpaddd_avx2(auVar83,local_33a0);
              auVar85._4_12_ = auVar94;
              auVar85._0_4_ = auVar83._16_4_;
              auVar65 = vpaddd_avx(auVar83._0_16_,auVar85);
              auVar72 = vpshufd_avx(auVar65,0xee);
              auVar65 = vpaddd_avx(auVar65,auVar72);
              auVar8 = vpblendd_avx2(auVar83,auVar95,0xc1);
              auVar72 = vpaddd_avx(auVar8._0_16_,auVar8._16_16_);
              auVar93 = vpsrldq_avx(auVar72,8);
              auVar72 = vpaddd_avx(auVar72,auVar93);
              auVar72 = vphaddd_avx(auVar65,auVar72);
              auVar8 = vpblendd_avx2(auVar83,auVar95,0x83);
              auVar65 = vpaddd_avx(auVar8._0_16_,auVar8._16_16_);
              auVar93 = vpsrldq_avx(auVar65,8);
              auVar65 = vpaddd_avx(auVar65,auVar93);
              local_33a0 = *(undefined1 (*) [32])((long)piVar50 + lVar45);
              auVar93 = vphaddd_avx(auVar65,auVar65);
              auVar65 = vblendps_avx(auVar64,auVar83._0_16_,8);
              auVar65 = vpaddd_avx(auVar65,auVar83._16_16_);
              auVar79 = vpsrldq_avx(auVar65,8);
              auVar65 = vpaddd_avx(auVar65,auVar79);
              auVar65 = vphaddd_avx(auVar65,auVar65);
              auVar72 = vpshufd_avx(auVar72,0xe8);
              auVar72 = vpunpcklqdq_avx(auVar72,auVar93);
              auVar74._0_4_ = auVar65._0_4_;
              auVar74._4_4_ = auVar74._0_4_;
              auVar74._8_4_ = auVar74._0_4_;
              auVar74._12_4_ = auVar74._0_4_;
              auVar65 = vpblendd_avx2(auVar72,auVar74,8);
              *pauVar49 = auVar65;
              lVar45 = lVar45 + 0x90;
              pauVar49 = pauVar49 + 8;
            } while (uVar55 * 0x90 != lVar45);
          }
          lVar45 = -0x180;
          do {
            auVar23._8_8_ = local_3420[5];
            auVar23._0_8_ = local_3420[4];
            auVar23._16_8_ = local_3420[6];
            auVar23._24_8_ = uStack_33e8;
            auVar17._8_8_ = local_3420[1];
            auVar17._0_8_ = local_3420[0];
            auVar17._16_8_ = local_3420[2];
            auVar17._24_8_ = local_3420[3];
            auVar83 = vpaddd_avx2(auVar23,auVar17);
            local_3420[0] = local_3420[4];
            local_3420[1] = local_3420[5];
            local_3420[2] = local_3420[6];
            local_3420[3] = uStack_33e8;
            local_3420[4] = local_33e0[0];
            local_3420[5] = local_33e0[1];
            local_3420[6] = local_33e0[2];
            uStack_33e8 = local_33e0[3];
            auVar29._8_8_ = local_33e0[1];
            auVar29._0_8_ = local_33e0[0];
            auVar29._16_8_ = local_33e0[2];
            auVar29._24_8_ = local_33e0[3];
            auVar83 = vpaddd_avx2(auVar83,auVar29);
            local_33e0[0] = local_33e0[4];
            local_33e0[1] = local_33e0[5];
            local_33e0[2] = local_33e0[6];
            local_33e0[3] = local_33e0[7];
            auVar35._8_8_ = local_33e0[5];
            auVar35._0_8_ = local_33e0[4];
            auVar35._16_8_ = local_33e0[6];
            auVar35._24_8_ = local_33e0[7];
            auVar83 = vpaddd_avx2(auVar83,auVar35);
            auVar83 = vpaddd_avx2(auVar83,local_33a0);
            auVar91._4_12_ = auVar94;
            auVar91._0_4_ = auVar83._16_4_;
            auVar65 = vpaddd_avx(auVar83._0_16_,auVar91);
            auVar72 = vpshufd_avx(auVar65,0xee);
            auVar65 = vpaddd_avx(auVar65,auVar72);
            auVar8 = vpblendd_avx2(auVar83,auVar95,0xc1);
            auVar72 = vpaddd_avx(auVar8._0_16_,auVar8._16_16_);
            auVar93 = vpsrldq_avx(auVar72,8);
            auVar72 = vpaddd_avx(auVar72,auVar93);
            auVar72 = vphaddd_avx(auVar65,auVar72);
            auVar8 = vpblendd_avx2(auVar83,auVar95,0x83);
            auVar65 = vpaddd_avx(auVar8._0_16_,auVar8._16_16_);
            auVar93 = vpsrldq_avx(auVar65,8);
            auVar65 = vpaddd_avx(auVar65,auVar93);
            auVar93 = vphaddd_avx(auVar65,auVar65);
            auVar65 = vblendps_avx(auVar64,auVar83._0_16_,8);
            auVar65 = vpaddd_avx(auVar65,auVar83._16_16_);
            auVar79 = vpsrldq_avx(auVar65,8);
            auVar65 = vpaddd_avx(auVar65,auVar79);
            auVar65 = vphaddd_avx(auVar65,auVar65);
            local_33e0[4] = local_33a0._0_8_;
            local_33e0[5] = local_33a0._8_8_;
            local_33e0[6] = local_33a0._16_8_;
            local_33e0[7] = local_33a0._24_8_;
            auVar72 = vpshufd_avx(auVar72,0xe8);
            auVar72 = vpunpcklqdq_avx(auVar72,auVar93);
            auVar86._0_4_ = auVar65._0_4_;
            auVar86._4_4_ = auVar86._0_4_;
            auVar86._8_4_ = auVar86._0_4_;
            auVar86._12_4_ = auVar86._0_4_;
            auVar65 = vpblendd_avx2(auVar72,auVar86,8);
            *(undefined1 (*) [16])(puVar53 + lVar45 + 0x10) = auVar65;
            lVar45 = lVar45 + 0x80;
          } while (lVar45 != 0);
          uVar44 = uVar44 + 4;
          pauVar52 = pauVar52 + 1;
          puVar53 = puVar53 + 0x10;
        } while ((long)uVar44 < (long)(int)(uVar61 - 4));
        uVar44 = uVar44 & 0xffffffff;
      }
      pauVar47 = (undefined1 (*) [32])(local_3260 + uVar44);
      lVar45 = 0x40;
      do {
        auVar83 = *pauVar47;
        auVar8 = vpshufd_avx2(auVar83,0x54);
        auVar77._0_16_ = ZEXT116(0) * auVar8._16_16_ + ZEXT116(1) * auVar83._0_16_;
        auVar77._16_16_ = ZEXT116(0) * auVar83._16_16_ + ZEXT116(1) * auVar8._16_16_;
        *(undefined1 (*) [32])((long)local_3420 + lVar45) = auVar77;
        pauVar47 = (undefined1 (*) [32])(pauVar47[4] + 0x10);
        lVar45 = lVar45 + 0x20;
      } while (lVar45 != 0xa0);
      local_3420[0] = local_33e0[0];
      local_3420[1] = local_33e0[1];
      local_3420[2] = local_33e0[2];
      local_3420[3] = local_33e0[3];
      local_3420[4] = local_33e0[0];
      local_3420[5] = local_33e0[1];
      local_3420[6] = local_33e0[2];
      uStack_33e8 = local_33e0[3];
      if (3 < uVar40) {
        pauVar52 = (undefined1 (*) [16])(local_2060 + uVar44 * 4);
        lVar45 = 0;
        do {
          auVar24._8_8_ = local_3420[5];
          auVar24._0_8_ = local_3420[4];
          auVar24._16_8_ = local_3420[6];
          auVar24._24_8_ = uStack_33e8;
          auVar18._8_8_ = local_3420[1];
          auVar18._0_8_ = local_3420[0];
          auVar18._16_8_ = local_3420[2];
          auVar18._24_8_ = local_3420[3];
          auVar83 = vpaddd_avx2(auVar24,auVar18);
          local_3420[0] = local_3420[4];
          local_3420[1] = local_3420[5];
          local_3420[2] = local_3420[6];
          local_3420[3] = uStack_33e8;
          local_3420[4] = local_33e0[0];
          local_3420[5] = local_33e0[1];
          local_3420[6] = local_33e0[2];
          uStack_33e8 = local_33e0[3];
          auVar30._8_8_ = local_33e0[1];
          auVar30._0_8_ = local_33e0[0];
          auVar30._16_8_ = local_33e0[2];
          auVar30._24_8_ = local_33e0[3];
          auVar83 = vpaddd_avx2(auVar83,auVar30);
          local_33e0[0] = local_33e0[4];
          local_33e0[1] = local_33e0[5];
          local_33e0[2] = local_33e0[6];
          local_33e0[3] = local_33e0[7];
          auVar36._8_8_ = local_33e0[5];
          auVar36._0_8_ = local_33e0[4];
          auVar36._16_8_ = local_33e0[6];
          auVar36._24_8_ = local_33e0[7];
          auVar83 = vpaddd_avx2(auVar83,auVar36);
          local_33e0[4] = local_33a0._0_8_;
          local_33e0[5] = local_33a0._8_8_;
          local_33e0[6] = local_33a0._16_8_;
          local_33e0[7] = local_33a0._24_8_;
          auVar81 = vpaddd_avx2(auVar83,local_33a0);
          auVar83 = *(undefined1 (*) [32])(*pauVar47 + lVar45);
          auVar8 = vshufps_avx(auVar83,auVar83,0x54);
          local_33a0._0_16_ = auVar83._0_16_;
          local_33a0._16_16_ = auVar8._16_16_;
          auVar89._4_12_ = auVar94;
          auVar89._0_4_ = auVar81._16_4_;
          auVar65 = vpaddd_avx(auVar81._0_16_,auVar89);
          auVar72 = vpshufd_avx(auVar65,0xee);
          auVar65 = vpaddd_avx(auVar65,auVar72);
          auVar83 = vpblendd_avx2(auVar81,auVar95,0xc1);
          auVar72 = vpaddd_avx(auVar83._0_16_,auVar83._16_16_);
          auVar93 = vpsrldq_avx(auVar72,8);
          auVar72 = vpaddd_avx(auVar72,auVar93);
          auVar72 = vphaddd_avx(auVar65,auVar72);
          auVar83 = vpblendd_avx2(auVar81,auVar95,0x83);
          auVar65 = vpaddd_avx(auVar83._0_16_,auVar83._16_16_);
          auVar93 = vpsrldq_avx(auVar65,8);
          auVar65 = vpaddd_avx(auVar65,auVar93);
          auVar93 = vphaddd_avx(auVar65,auVar65);
          auVar65 = vblendps_avx(auVar64,auVar81._0_16_,8);
          auVar65 = vpaddd_avx(auVar65,auVar81._16_16_);
          auVar79 = vpsrldq_avx(auVar65,8);
          auVar65 = vpaddd_avx(auVar65,auVar79);
          auVar65 = vphaddd_avx(auVar65,auVar65);
          auVar72 = vpshufd_avx(auVar72,0xe8);
          auVar72 = vpunpcklqdq_avx(auVar72,auVar93);
          auVar75._0_4_ = auVar65._0_4_;
          auVar75._4_4_ = auVar75._0_4_;
          auVar75._8_4_ = auVar75._0_4_;
          auVar75._12_4_ = auVar75._0_4_;
          auVar65 = vpblendd_avx2(auVar72,auVar75,8);
          *pauVar52 = auVar65;
          lVar45 = lVar45 + 0x90;
          pauVar52 = pauVar52 + 8;
        } while (uVar55 * 0x90 != lVar45);
      }
      lVar45 = -0x180;
      do {
        auVar25._8_8_ = local_3420[5];
        auVar25._0_8_ = local_3420[4];
        auVar25._16_8_ = local_3420[6];
        auVar25._24_8_ = uStack_33e8;
        auVar19._8_8_ = local_3420[1];
        auVar19._0_8_ = local_3420[0];
        auVar19._16_8_ = local_3420[2];
        auVar19._24_8_ = local_3420[3];
        auVar83 = vpaddd_avx2(auVar25,auVar19);
        local_3420[0] = local_3420[4];
        local_3420[1] = local_3420[5];
        local_3420[2] = local_3420[6];
        local_3420[3] = uStack_33e8;
        local_3420[4] = local_33e0[0];
        local_3420[5] = local_33e0[1];
        local_3420[6] = local_33e0[2];
        uStack_33e8 = local_33e0[3];
        auVar31._8_8_ = local_33e0[1];
        auVar31._0_8_ = local_33e0[0];
        auVar31._16_8_ = local_33e0[2];
        auVar31._24_8_ = local_33e0[3];
        auVar83 = vpaddd_avx2(auVar83,auVar31);
        local_33e0[0] = local_33e0[4];
        local_33e0[1] = local_33e0[5];
        local_33e0[2] = local_33e0[6];
        local_33e0[3] = local_33e0[7];
        auVar37._8_8_ = local_33e0[5];
        auVar37._0_8_ = local_33e0[4];
        auVar37._16_8_ = local_33e0[6];
        auVar37._24_8_ = local_33e0[7];
        auVar83 = vpaddd_avx2(auVar83,auVar37);
        auVar83 = vpaddd_avx2(auVar83,local_33a0);
        auVar92._4_12_ = auVar94;
        auVar92._0_4_ = auVar83._16_4_;
        auVar65 = vpaddd_avx(auVar83._0_16_,auVar92);
        auVar72 = vpshufd_avx(auVar65,0xee);
        auVar65 = vpaddd_avx(auVar65,auVar72);
        auVar8 = vpblendd_avx2(auVar83,auVar95,0xc1);
        auVar72 = vpaddd_avx(auVar8._0_16_,auVar8._16_16_);
        auVar93 = vpsrldq_avx(auVar72,8);
        auVar72 = vpaddd_avx(auVar72,auVar93);
        auVar72 = vphaddd_avx(auVar65,auVar72);
        auVar8 = vpblendd_avx2(auVar83,auVar95,0x83);
        auVar65 = vpaddd_avx(auVar8._0_16_,auVar8._16_16_);
        auVar93 = vpsrldq_avx(auVar65,8);
        auVar65 = vpaddd_avx(auVar65,auVar93);
        auVar93 = vphaddd_avx(auVar65,auVar65);
        auVar65 = vblendps_avx(auVar64,auVar83._0_16_,8);
        auVar65 = vpaddd_avx(auVar65,auVar83._16_16_);
        auVar79 = vpsrldq_avx(auVar65,8);
        auVar65 = vpaddd_avx(auVar65,auVar79);
        auVar65 = vphaddd_avx(auVar65,auVar65);
        local_33e0[4] = local_33a0._0_8_;
        local_33e0[5] = local_33a0._8_8_;
        local_33e0[6] = local_33a0._16_8_;
        local_33e0[7] = local_33a0._24_8_;
        auVar72 = vpshufd_avx(auVar72,0xe8);
        auVar72 = vpunpcklqdq_avx(auVar72,auVar93);
        auVar87._0_4_ = auVar65._0_4_;
        auVar87._4_4_ = auVar87._0_4_;
        auVar87._8_4_ = auVar87._0_4_;
        auVar87._12_4_ = auVar87._0_4_;
        auVar65 = vpblendd_avx2(auVar72,auVar87,8);
        *(undefined1 (*) [16])(local_2060 + lVar45 + (ulong)bVar38 * 0x80 + uVar44 * 4) = auVar65;
        lVar45 = lVar45 + 0x80;
      } while (lVar45 != 0);
      local_32c0._0_8_ = dVar63 * local_3280;
      local_32c0._8_8_ = dVar63 * dStack_3278;
      local_32c0._16_8_ = dVar63 * dStack_3270;
      local_32c0._24_8_ = dVar63 * dStack_3268;
      auVar95 = vcvtdq2pd_avx(*(undefined1 (*) [16])subblock_mses);
      local_32a0[0] = auVar95._0_8_ * 0.008333333333333333;
      local_32a0[1] = auVar95._8_8_ * 0.008333333333333333;
      local_32a0[2] = auVar95._16_8_ * 0.008333333333333333;
      local_32a0[3] = auVar95._24_8_ * 0.008333333333333333;
      cVar11 = (char)iVar48;
      local_3328 = uVar56;
      if (tf_wgt_calc_lvl == 0) {
        auVar78 = ZEXT1664(ZEXT816(0x401c000000000000));
        if (uVar40 != 0) {
          local_3308 = (ulong)(bVar38 >> 1);
          local_3318 = accum + lVar59;
          local_3320 = count + lVar59;
          local_3310 = (ulong)(uVar61 * 2);
          uVar56 = 0;
          puVar53 = local_2060;
          piVar50 = local_1060;
          iVar48 = 0;
          do {
            auVar64 = local_3380;
            if (uVar61 != 0) {
              local_3380._4_4_ = 0;
              local_3380._0_4_ = (uint)(local_3308 <= uVar56) * 2;
              local_3380._8_8_ = auVar64._8_8_;
              local_3360._0_8_ = local_3318 + iVar48;
              local_32f8 = local_3320 + iVar48;
              uVar55 = 0;
              local_3300 = uVar56;
              do {
                uVar56 = (ulong)(((uint)(bVar39 >> 1 <= uVar55) | local_3380._0_4_) << 3);
                dVar63 = (dVar71 * (double)((uint)(piVar50[uVar55] + *(int *)(puVar53 + uVar55 * 4))
                                           >> (cVar11 * '\x02' - 0x10U & 0x1f)) *
                          0.041666666666666664 + *(double *)((long)local_32a0 + uVar56)) *
                         *(double *)(local_32c0 + uVar56);
                uVar5 = *(ushort *)(*pauVar54 + uVar55 * 2);
                auVar76._0_8_ = -dVar63;
                auVar76._8_8_ = 0x8000000000000000;
                auVar69._8_8_ = 0;
                auVar69._0_8_ = dVar63;
                auVar64 = vcmpsd_avx(auVar69,auVar78._0_16_,1);
                auVar80._8_8_ = 0xc01c000000000000;
                auVar80._0_8_ = 0xc01c000000000000;
                auVar64 = vblendvpd_avx(auVar80,auVar76,auVar64);
                dVar63 = exp(auVar64._0_8_);
                auVar78 = ZEXT1664(ZEXT816(0x401c000000000000));
                local_32f8[uVar55] = local_32f8[uVar55] + (short)(int)(dVar63 * 1000.0);
                piVar2 = (int *)(local_3360._0_8_ + uVar55 * 4);
                *piVar2 = *piVar2 + (uint)uVar5 * (int)(dVar63 * 1000.0);
                uVar55 = uVar55 + 1;
              } while (uVar43 != uVar55);
              iVar48 = iVar48 + (int)uVar55;
              uVar56 = local_3300;
            }
            uVar56 = uVar56 + 1;
            piVar50 = piVar50 + 0x20;
            puVar53 = puVar53 + 0x80;
            pauVar54 = (undefined1 (*) [32])(*pauVar54 + local_3310);
          } while (uVar56 != uVar42);
        }
      }
      else if (uVar40 != 0) {
        puVar1 = count + lVar59;
        local_3380._0_8_ = puVar1;
        uVar56 = 0;
        puVar53 = local_2060;
        piVar50 = local_1060;
        iVar48 = 0;
        do {
          if (uVar61 != 0) {
            uVar55 = 0;
            do {
              uVar44 = (ulong)(((uint)(bVar39 >> 1 <= uVar55) | (uint)(bVar38 >> 1 <= uVar56) * 2)
                              << 3);
              auVar68._8_8_ = 0;
              auVar68._0_8_ =
                   (dVar71 * (double)((uint)(piVar50[uVar55] + *(int *)(puVar53 + uVar55 * 4)) >>
                                     (cVar11 * '\x02' - 0x10U & 0x1f)) * 0.041666666666666664 +
                   *(double *)((long)local_32a0 + uVar44)) * *(double *)(local_32c0 + uVar44);
              auVar64 = vminsd_avx(auVar68,ZEXT816(0x401c000000000000));
              iVar60 = (int)((float)((int)((float)auVar64._0_8_ * -12102203.0) + 0x3f7f127f) *
                             1000.0 + 0.5);
              uVar5 = *(ushort *)(*pauVar54 + uVar55 * 2);
              puVar1[(long)iVar48 + uVar55] = puVar1[(long)iVar48 + uVar55] + (short)iVar60;
              accum[lVar59 + (long)iVar48 + uVar55] =
                   accum[lVar59 + (long)iVar48 + uVar55] + (uint)uVar5 * iVar60;
              uVar55 = uVar55 + 1;
            } while (uVar43 != uVar55);
            iVar48 = iVar48 + (int)uVar55;
          }
          uVar56 = uVar56 + 1;
          piVar50 = piVar50 + 0x20;
          puVar53 = puVar53 + 0x80;
          pauVar54 = (undefined1 (*) [32])(*pauVar54 + uVar61 * 2);
        } while (uVar56 != uVar42);
      }
      local_3464 = local_3464 + uVar61 * uVar40;
      uVar56 = local_3328 + 1;
    } while (uVar56 != local_3340);
  }
  return;
}

Assistant:

void av1_highbd_apply_temporal_filter_avx2(
    const YV12_BUFFER_CONFIG *frame_to_filter, const MACROBLOCKD *mbd,
    const BLOCK_SIZE block_size, const int mb_row, const int mb_col,
    const int num_planes, const double *noise_levels, const MV *subblock_mvs,
    const int *subblock_mses, const int q_factor, const int filter_strength,
    int tf_wgt_calc_lvl, const uint8_t *pred, uint32_t *accum,
    uint16_t *count) {
  const int is_high_bitdepth = frame_to_filter->flags & YV12_FLAG_HIGHBITDEPTH;
  assert(block_size == BLOCK_32X32 && "Only support 32x32 block with sse2!");
  assert(TF_WINDOW_LENGTH == 5 && "Only support window length 5 with sse2!");
  assert(num_planes >= 1 && num_planes <= MAX_MB_PLANE);
  (void)is_high_bitdepth;

  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int min_frame_size = AOMMIN(frame_height, frame_width);
  // Variables to simplify combined error calculation.
  const double inv_factor = 1.0 / ((TF_WINDOW_BLOCK_BALANCE_WEIGHT + 1) *
                                   TF_SEARCH_ERROR_NORM_WEIGHT);
  const double weight_factor =
      (double)TF_WINDOW_BLOCK_BALANCE_WEIGHT * inv_factor;
  // Adjust filtering based on q.
  // Larger q -> stronger filtering -> larger weight.
  // Smaller q -> weaker filtering -> smaller weight.
  double q_decay = pow((double)q_factor / TF_Q_DECAY_THRESHOLD, 2);
  q_decay = CLIP(q_decay, 1e-5, 1);
  if (q_factor >= TF_QINDEX_CUTOFF) {
    // Max q_factor is 255, therefore the upper bound of q_decay is 8.
    // We do not need a clip here.
    q_decay = 0.5 * pow((double)q_factor / 64, 2);
  }
  // Smaller strength -> smaller filtering weight.
  double s_decay = pow((double)filter_strength / TF_STRENGTH_THRESHOLD, 2);
  s_decay = CLIP(s_decay, 1e-5, 1);
  double d_factor[4] = { 0 };
  uint32_t frame_sse[SSE_STRIDE * BH] = { 0 };
  uint32_t luma_sse_sum[BW * BH] = { 0 };
  uint16_t *pred1 = CONVERT_TO_SHORTPTR(pred);

  for (int subblock_idx = 0; subblock_idx < 4; subblock_idx++) {
    // Larger motion vector -> smaller filtering weight.
    const MV mv = subblock_mvs[subblock_idx];
    const double distance = sqrt(pow(mv.row, 2) + pow(mv.col, 2));
    double distance_threshold = min_frame_size * TF_SEARCH_DISTANCE_THRESHOLD;
    distance_threshold = AOMMAX(distance_threshold, 1);
    d_factor[subblock_idx] = distance / distance_threshold;
    d_factor[subblock_idx] = AOMMAX(d_factor[subblock_idx], 1);
  }

  // Handle planes in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    const uint32_t plane_h = mb_height >> mbd->plane[plane].subsampling_y;
    const uint32_t plane_w = mb_width >> mbd->plane[plane].subsampling_x;
    const uint32_t frame_stride = frame_to_filter->strides[plane == 0 ? 0 : 1];
    const int frame_offset = mb_row * plane_h * frame_stride + mb_col * plane_w;

    const uint16_t *ref =
        CONVERT_TO_SHORTPTR(frame_to_filter->buffers[plane]) + frame_offset;
    const int ss_x_shift =
        mbd->plane[plane].subsampling_x - mbd->plane[AOM_PLANE_Y].subsampling_x;
    const int ss_y_shift =
        mbd->plane[plane].subsampling_y - mbd->plane[AOM_PLANE_Y].subsampling_y;
    const int num_ref_pixels = TF_WINDOW_LENGTH * TF_WINDOW_LENGTH +
                               ((plane) ? (1 << (ss_x_shift + ss_y_shift)) : 0);
    const double inv_num_ref_pixels = 1.0 / num_ref_pixels;
    // Larger noise -> larger filtering weight.
    const double n_decay = 0.5 + log(2 * noise_levels[plane] + 5.0);
    // Decay factors for non-local mean approach.
    const double decay_factor = 1 / (n_decay * q_decay * s_decay);

    // Filter U-plane and V-plane using Y-plane. This is because motion
    // search is only done on Y-plane, so the information from Y-plane
    // will be more accurate. The luma sse sum is reused in both chroma
    // planes.
    if (plane == AOM_PLANE_U) {
      for (unsigned int i = 0, k = 0; i < plane_h; i++) {
        for (unsigned int j = 0; j < plane_w; j++, k++) {
          for (int ii = 0; ii < (1 << ss_y_shift); ++ii) {
            for (int jj = 0; jj < (1 << ss_x_shift); ++jj) {
              const int yy = (i << ss_y_shift) + ii;  // Y-coord on Y-plane.
              const int xx = (j << ss_x_shift) + jj;  // X-coord on Y-plane.
              luma_sse_sum[i * BW + j] += frame_sse[yy * SSE_STRIDE + xx + 2];
            }
          }
        }
      }
    }

    highbd_apply_temporal_filter(
        ref, frame_stride, pred1 + plane_offset, plane_w, plane_w, plane_h,
        subblock_mses, accum + plane_offset, count + plane_offset, frame_sse,
        luma_sse_sum, mbd->bd, inv_num_ref_pixels, decay_factor, inv_factor,
        weight_factor, d_factor, tf_wgt_calc_lvl);
    plane_offset += plane_h * plane_w;
  }
}